

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_extract.cpp
# Opt level: O2

int __thiscall
FNodeBuilder::CloseSubsector
          (FNodeBuilder *this,TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t> *segs,
          int subsector,vertex_t *outVerts)

{
  uint uVar1;
  subsector_t *psVar2;
  USegPtr *pUVar3;
  FPrivVert *pFVar4;
  FPrivSeg *pFVar5;
  DWORD DVar6;
  uint uVar7;
  angle_t aVar8;
  int iVar9;
  int iVar10;
  seg_t *psVar11;
  FPrivSeg *pFVar12;
  int iVar13;
  uint uVar14;
  int subsector_00;
  ulong uVar15;
  TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t> *pTVar16;
  uint x;
  FNodeBuilder *pFVar18;
  FPrivSeg *seg;
  bool bVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  angle_t local_8c;
  FPrivSeg *local_88;
  FNodeBuilder *local_80;
  ulong local_78;
  FPrivSeg *local_70;
  uint local_64;
  int local_60;
  int local_5c;
  vertex_t *local_58;
  TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t> *local_50;
  long local_48;
  seg_t *local_40;
  FPrivSeg *local_38;
  FPrivSeg *pFVar17;
  
  local_70 = (FPrivSeg *)CONCAT44(local_70._4_4_,subsector);
  psVar2 = (this->Subsectors).Array;
  pFVar12 = (this->Segs).Array;
  local_40 = psVar2[subsector].firstline;
  uVar7 = psVar2[subsector].numlines;
  local_78 = (ulong)(uVar7 + (int)local_40);
  uVar15 = (ulong)local_40 & 0xffffffff;
  pUVar3 = (this->SegList).Array;
  uVar1 = pUVar3[uVar15].SegNum;
  seg = pFVar12 + uVar1;
  pFVar4 = (this->Vertices).Array;
  dVar20 = 0.0;
  dVar21 = 0.0;
  bVar19 = false;
  for (; uVar15 < local_78; uVar15 = uVar15 + 1) {
    uVar14 = pUVar3[uVar15].SegNum;
    dVar20 = dVar20 + (double)pFVar4[pFVar12[uVar14].v2].super_FSimpleVert.x +
                      (double)pFVar4[pFVar12[uVar14].v1].super_FSimpleVert.x;
    dVar21 = dVar21 + (double)pFVar4[pFVar12[uVar14].v2].super_FSimpleVert.y +
                      (double)pFVar4[pFVar12[uVar14].v1].super_FSimpleVert.y;
    bVar19 = (bool)(bVar19 | pFVar12[uVar1].planenum != pFVar12[uVar14].planenum);
  }
  dVar22 = (double)uVar7;
  local_5c = (int)((dVar20 / dVar22) * 0.5);
  local_60 = (int)((dVar21 / dVar22) * 0.5);
  local_8c = PointToAngle(pFVar4[seg->v1].super_FSimpleVert.x - local_5c,
                          pFVar4[seg->v1].super_FSimpleVert.y - local_60);
  pTVar16 = segs;
  pFVar18 = this;
  DVar6 = PushGLSeg(this,segs,seg,outVerts);
  seg->storedseg = DVar6;
  local_48 = (long)seg->v1;
  local_88 = seg;
  if (bVar19) {
    iVar13 = 1;
    psVar11 = local_40;
    local_80 = this;
    local_58 = outVerts;
    local_50 = segs;
    do {
      subsector_00 = (int)pTVar16;
      uVar7 = (int)psVar11 + 1;
      if ((uint)local_78 <= uVar7) break;
      uVar15 = (ulong)local_40 & 0xffffffff;
      pFVar12 = (FPrivSeg *)0x0;
      local_64 = uVar7;
      local_38 = seg;
      uVar7 = 0xffffffff;
      while( true ) {
        uVar1 = (local_80->SegList).Array[uVar15].SegNum;
        pFVar5 = (local_80->Segs).Array;
        pFVar4 = (local_80->Vertices).Array;
        seg = pFVar5 + uVar1;
        x = pFVar4[pFVar5[uVar1].v1].super_FSimpleVert.x - local_5c;
        pFVar18 = (FNodeBuilder *)(ulong)x;
        uVar14 = pFVar4[pFVar5[uVar1].v1].super_FSimpleVert.y - local_60;
        pFVar17 = (FPrivSeg *)(ulong)uVar14;
        local_70 = pFVar12;
        aVar8 = PointToAngle(x,uVar14);
        segs = local_50;
        outVerts = local_58;
        uVar14 = local_8c - aVar8;
        iVar9 = local_38->v2;
        pFVar12 = seg;
        if (pFVar5[uVar1].v1 == iVar9) break;
        bVar19 = uVar14 < uVar7;
        pFVar18 = (FNodeBuilder *)CONCAT71((int7)((ulong)pFVar18 >> 8),uVar14 != 0);
        if (!bVar19 || uVar14 == 0) {
          pFVar12 = local_70;
          uVar14 = uVar7;
        }
        uVar7 = (int)uVar15 + 1;
        uVar15 = (ulong)uVar7;
        pFVar17 = (FPrivSeg *)CONCAT71((int7)((ulong)pFVar17 >> 8),bVar19);
        if (((uint)local_78 <= uVar7) ||
           (pFVar17 = pFVar12, uVar7 = uVar14, pFVar5[uVar1].v1 == iVar9)) break;
      }
      if (pFVar12 != (FPrivSeg *)0x0) {
        seg = pFVar12;
      }
      if (iVar9 != seg->v1) {
        PushConnectingGLSeg(pFVar18,(int)pFVar17,local_50,local_58 + iVar9,local_58 + seg->v1);
        iVar13 = iVar13 + 1;
      }
      local_8c = local_8c - uVar14;
      pTVar16 = segs;
      pFVar18 = local_80;
      DVar6 = PushGLSeg(local_80,segs,seg,outVerts);
      subsector_00 = (int)pTVar16;
      seg->storedseg = DVar6;
      iVar13 = iVar13 + 1;
      psVar11 = (seg_t *)(ulong)local_64;
    } while (seg->v2 != (int)local_48);
  }
  else {
    iVar13 = (int)local_70;
    iVar9 = OutputDegenerateSubsector(this,segs,(int)local_70,true,0.0,&local_88,outVerts);
    iVar10 = OutputDegenerateSubsector
                       (this,segs,iVar13,false,1.79769313486232e+308,&local_88,outVerts);
    pTVar16 = segs;
    iVar13 = OutputDegenerateSubsector
                       (this,segs,iVar13,true,-1.79769313486232e+308,&local_88,outVerts);
    subsector_00 = (int)pTVar16;
    iVar13 = iVar13 + iVar10 + iVar9 + 1;
    pFVar18 = this;
    seg = local_88;
  }
  local_88 = seg;
  if (local_88->v2 != (int)local_48) {
    PushConnectingGLSeg(pFVar18,subsector_00,segs,outVerts + local_88->v2,outVerts + local_48);
    iVar13 = iVar13 + 1;
  }
  return iVar13;
}

Assistant:

int FNodeBuilder::CloseSubsector (TArray<glseg_t> &segs, int subsector, vertex_t *outVerts)
{
	FPrivSeg *seg, *prev;
	angle_t prevAngle;
	double accumx, accumy;
	fixed_t midx, midy;
	int firstVert;
	DWORD first, max, count, i, j;
	bool diffplanes;
	int firstplane;

	first = (DWORD)(size_t)Subsectors[subsector].firstline;
	max = first + Subsectors[subsector].numlines;
	count = 0;

	accumx = accumy = 0.0;
	diffplanes = false;
	firstplane = Segs[SegList[first].SegNum].planenum;

	// Calculate the midpoint of the subsector and also check for degenerate subsectors.
	// A subsector is degenerate if it exists in only one dimension, which can be
	// detected when all the segs lie in the same plane. This can happen if you have
	// outward-facing lines in the void that don't point toward any sector. (Some of the
	// polyobjects in Hexen are constructed like this.)
	for (i = first; i < max; ++i)
	{
		seg = &Segs[SegList[i].SegNum];
		accumx += double(Vertices[seg->v1].x) + double(Vertices[seg->v2].x);
		accumy += double(Vertices[seg->v1].y) + double(Vertices[seg->v2].y);
		if (firstplane != seg->planenum)
		{
			diffplanes = true;
		}
	}

	midx = fixed_t(accumx / (max - first) / 2);
	midy = fixed_t(accumy / (max - first) / 2);

	seg = &Segs[SegList[first].SegNum];
	prevAngle = PointToAngle (Vertices[seg->v1].x - midx, Vertices[seg->v1].y - midy);
	seg->storedseg = PushGLSeg (segs, seg, outVerts);
	count = 1;
	prev = seg;
	firstVert = seg->v1;

#ifdef DD
	Printf(PRINT_LOG, "--%d--\n", subsector);
	for (j = first; j < max; ++j)
	{
		seg = &Segs[SegList[j].SegNum];
		angle_t ang = PointToAngle (Vertices[seg->v1].x - midx, Vertices[seg->v1].y - midy);
		Printf(PRINT_LOG, "%d%c %5d(%5d,%5d)->%5d(%5d,%5d) - %3.5f  %d,%d  [%08x,%08x]-[%08x,%08x]\n", j,
			seg->linedef == -1 ? '+' : ':',
			seg->v1, Vertices[seg->v1].x>>16, Vertices[seg->v1].y>>16,
			seg->v2, Vertices[seg->v2].x>>16, Vertices[seg->v2].y>>16,
			double(ang/2)*180/(1<<30),
			seg->planenum, seg->planefront,
			Vertices[seg->v1].x, Vertices[seg->v1].y,
			Vertices[seg->v2].x, Vertices[seg->v2].y);
	}
#endif

	if (diffplanes)
	{ // A well-behaved subsector. Output the segs sorted by the angle formed by connecting
	  // the subsector's center to their first vertex.

		D(Printf(PRINT_LOG, "Well behaved subsector\n"));
		for (i = first + 1; i < max; ++i)
		{
			angle_t bestdiff = ANGLE_MAX;
			FPrivSeg *bestseg = NULL;
			DWORD bestj = DWORD_MAX;
			j = first;
			do
			{
				seg = &Segs[SegList[j].SegNum];
				angle_t ang = PointToAngle (Vertices[seg->v1].x - midx, Vertices[seg->v1].y - midy);
				angle_t diff = prevAngle - ang;
				if (seg->v1 == prev->v2)
				{
					bestdiff = diff;
					bestseg = seg;
					bestj = j;
					break;
				}
				if (diff < bestdiff && diff > 0)
				{
					bestdiff = diff;
					bestseg = seg;
					bestj = j;
				}
			}
			while (++j < max);
			// Is a NULL bestseg actually okay?
			if (bestseg != NULL)
			{
				seg = bestseg;
			}
			if (prev->v2 != seg->v1)
			{
				// Add a new miniseg to connect the two segs
				PushConnectingGLSeg (subsector, segs, &outVerts[prev->v2], &outVerts[seg->v1]);
				count++;
			}
#ifdef DD
			Printf(PRINT_LOG, "+%d\n", bestj);
#endif
			prevAngle -= bestdiff;
			seg->storedseg = PushGLSeg (segs, seg, outVerts);
			count++;
			prev = seg;
			if (seg->v2 == firstVert)
			{
				prev = seg;
				break;
			}
		}
#ifdef DD
		Printf(PRINT_LOG, "\n");
#endif
	}
	else
	{ // A degenerate subsector. These are handled in three stages:
	  // Stage 1. Proceed in the same direction as the start seg until we
	  //          hit the seg furthest from it.
	  // Stage 2. Reverse direction and proceed until we hit the seg
	  //          furthest from the start seg.
	  // Stage 3. Reverse direction again and insert segs until we get
	  //          to the start seg.
	  // A dot product serves to determine distance from the start seg.

		D(Printf(PRINT_LOG, "degenerate subsector\n"));

		// Stage 1. Go forward.
		count += OutputDegenerateSubsector (segs, subsector, true, 0, prev, outVerts);

		// Stage 2. Go backward.
		count += OutputDegenerateSubsector (segs, subsector, false, DBL_MAX, prev, outVerts);

		// Stage 3. Go forward again.
		count += OutputDegenerateSubsector (segs, subsector, true, -DBL_MAX, prev, outVerts);
	}

	if (prev->v2 != firstVert)
	{
		PushConnectingGLSeg (subsector, segs, &outVerts[prev->v2], &outVerts[firstVert]);
		count++;
	}
#ifdef DD
	Printf(PRINT_LOG, "Output GL subsector %d:\n", subsector);
	for (i = segs.Size() - count; i < (int)segs.Size(); ++i)
	{
		Printf(PRINT_LOG, "  Seg %5d%c(%5d,%5d)-(%5d,%5d)  [%08x,%08x]-[%08x,%08x]\n", i,
			segs[i].linedef == NULL ? '+' : ' ',
			segs[i].v1->fixX()>>16,
			segs[i].v1->fixY()>>16,
			segs[i].v2->fixX()>>16,
			segs[i].v2->fixY()>>16,
			segs[i].v1->fixX(),
			segs[i].v1->fixY(),
			segs[i].v2->fixX(),
			segs[i].v2->fixY());
	}
#endif

	return count;
}